

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanBlockEntry(Scanner *this)

{
  int iVar1;
  size_type sVar2;
  ParserException *pPVar3;
  allocator local_89;
  Mark local_88;
  undefined1 local_78 [32];
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined8 uStack_2c;
  
  if ((this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_flows).c.
      super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
    local_88.pos = (this->INPUT).m_mark.pos;
    local_88.line = (this->INPUT).m_mark.line;
    local_88.column = (this->INPUT).m_mark.column;
    std::__cxx11::string::string((string *)local_78,"illegal block entry",&local_89);
    ParserException::ParserException(pPVar3,&local_88,(string *)local_78);
    __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
  }
  if (this->m_simpleKeyAllowed != false) {
    PushIndentTo(this,(this->INPUT).m_mark.column,SEQ);
    this->m_simpleKeyAllowed = true;
    this->m_canBeJSONFlow = false;
    sVar2._0_4_ = (this->INPUT).m_mark.pos;
    sVar2._4_4_ = (this->INPUT).m_mark.line;
    iVar1 = (this->INPUT).m_mark.column;
    YAML::Stream::eat(&this->INPUT,1);
    local_78._24_8_ = &local_50;
    local_78._0_8_ = (pointer)0x700000000;
    local_58 = 0;
    local_50._M_local_buf[0] = '\0';
    local_40 = (pointer)0x0;
    uStack_38 = 0;
    uStack_34 = 0;
    uStack_30 = 0;
    uStack_2c = 0;
    local_78._8_8_ = sVar2;
    local_78._16_4_ = iVar1;
    std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
              (&(this->m_tokens).c,(Token *)local_78);
    Token::~Token((Token *)local_78);
    return;
  }
  pPVar3 = (ParserException *)__cxa_allocate_exception(0x40);
  local_88.pos = (this->INPUT).m_mark.pos;
  local_88.line = (this->INPUT).m_mark.line;
  local_88.column = (this->INPUT).m_mark.column;
  std::__cxx11::string::string((string *)local_78,"illegal block entry",&local_89);
  ParserException::ParserException(pPVar3,&local_88,(string *)local_78);
  __cxa_throw(pPVar3,&ParserException::typeinfo,BadConversion::~BadConversion);
}

Assistant:

void Scanner::ScanBlockEntry() {
  // we better be in the block context!
  if (InFlowContext())
    throw ParserException(INPUT.mark(), ErrorMsg::BLOCK_ENTRY);

  // can we put it here?
  if (!m_simpleKeyAllowed)
    throw ParserException(INPUT.mark(), ErrorMsg::BLOCK_ENTRY);

  PushIndentTo(INPUT.column(), IndentMarker::SEQ);
  m_simpleKeyAllowed = true;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(1);
  m_tokens.push(Token(Token::BLOCK_ENTRY, mark));
}